

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

size_t sk_proxy_write_oob(Socket *s,void *data,size_t len)

{
  ProxySocket *ps;
  size_t len_local;
  void *data_local;
  Socket *s_local;
  
  if (s[-10].vt == (SocketVtable *)0x0) {
    s_local = (Socket *)sk_write_oob((Socket *)s[-0x20].vt,data,len);
  }
  else {
    bufchain_clear((bufchain *)(s + -0x1a));
    bufchain_clear((bufchain *)(s + -0x15));
    bufchain_add((bufchain *)(s + -0x15),data,len);
    s_local = (Socket *)len;
  }
  return (size_t)s_local;
}

Assistant:

static size_t sk_proxy_write_oob (Socket *s, const void *data, size_t len)
{
    ProxySocket *ps = container_of(s, ProxySocket, sock);

    if (ps->pn) {
        bufchain_clear(&ps->pending_output_data);
        bufchain_clear(&ps->pending_oob_output_data);
        bufchain_add(&ps->pending_oob_output_data, data, len);
        return len;
    }
    return sk_write_oob(ps->sub_socket, data, len);
}